

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

int ExpandMatrix(VP8Matrix *m,int type)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    bVar1 = kBiasMatrices[(uint)type][lVar6 == 1];
    uVar3 = 0x20000 / m->q_[lVar6];
    m->iq_[lVar6] = (uint16_t)uVar3;
    uVar5 = (uint)bVar1 << 9;
    m->bias_[lVar6] = uVar5;
    m->zthresh_[lVar6] = (uVar5 ^ 0x1ffff) / (uVar3 & 0xffff);
  }
  for (lVar6 = 0x12; lVar6 != 0x20; lVar6 = lVar6 + 1) {
    m->q_[lVar6 + -0x10] = m->q_[1];
    m->q_[lVar6] = m->iq_[1];
    *(uint32_t *)(m->q_ + lVar6 * 2) = m->bias_[1];
    m->bias_[lVar6] = m->zthresh_[1];
  }
  iVar4 = 0;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    if (type == 0) {
      uVar2 = m->q_[lVar6];
      m->sharpen_[lVar6] = (uint16_t)((uint)""[lVar6] * (uint)uVar2 >> 0xb);
    }
    else {
      m->sharpen_[lVar6] = 0;
      uVar2 = m->q_[lVar6];
    }
    iVar4 = iVar4 + (uint)uVar2;
  }
  return iVar4 + 8U >> 4;
}

Assistant:

static int ExpandMatrix(VP8Matrix* const m, int type) {
  int i, sum;
  for (i = 0; i < 2; ++i) {
    const int is_ac_coeff = (i > 0);
    const int bias = kBiasMatrices[type][is_ac_coeff];
    m->iq_[i] = (1 << QFIX) / m->q_[i];
    m->bias_[i] = BIAS(bias);
    // zthresh_ is the exact value such that QUANTDIV(coeff, iQ, B) is:
    //   * zero if coeff <= zthresh
    //   * non-zero if coeff > zthresh
    m->zthresh_[i] = ((1 << QFIX) - 1 - m->bias_[i]) / m->iq_[i];
  }
  for (i = 2; i < 16; ++i) {
    m->q_[i] = m->q_[1];
    m->iq_[i] = m->iq_[1];
    m->bias_[i] = m->bias_[1];
    m->zthresh_[i] = m->zthresh_[1];
  }
  for (sum = 0, i = 0; i < 16; ++i) {
    if (type == 0) {  // we only use sharpening for AC luma coeffs
      m->sharpen_[i] = (kFreqSharpening[i] * m->q_[i]) >> SHARPEN_BITS;
    } else {
      m->sharpen_[i] = 0;
    }
    sum += m->q_[i];
  }
  return (sum + 8) >> 4;
}